

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O3

bool __thiscall
isotropic::scatter(isotropic *this,ray *r_in,hit_record *rec,color *attenuation,ray *scattered)

{
  element_type *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  vec3 p;
  double local_48;
  double dStack_40;
  double local_38;
  
  vec3::random();
  uVar6 = SUB84(local_48,0);
  uVar7 = (undefined4)((ulong)local_48 >> 0x20);
  uVar8 = SUB84(dStack_40,0);
  uVar9 = (undefined4)((ulong)dStack_40 >> 0x20);
  dVar11 = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  while ((dVar11 <= 1e-160 || (1.0 < dVar11))) {
    vec3::random();
    uVar6 = SUB84(local_48,0);
    uVar7 = (undefined4)((ulong)local_48 >> 0x20);
    uVar8 = SUB84(dStack_40,0);
    uVar9 = (undefined4)((ulong)dStack_40 >> 0x20);
    dVar11 = local_38 * local_38 + local_48 * local_48 + dStack_40 * dStack_40;
  }
  dVar10 = 1.0 / SQRT(dVar11);
  dVar11 = r_in->tm;
  uVar2 = *(undefined4 *)(rec->p).e;
  uVar3 = *(undefined4 *)((long)(rec->p).e + 4);
  uVar4 = *(undefined4 *)((rec->p).e + 1);
  uVar5 = *(undefined4 *)((long)(rec->p).e + 0xc);
  (scattered->orig).e[2] = (rec->p).e[2];
  *(undefined4 *)(scattered->orig).e = uVar2;
  *(undefined4 *)((long)(scattered->orig).e + 4) = uVar3;
  *(undefined4 *)((scattered->orig).e + 1) = uVar4;
  *(undefined4 *)((long)(scattered->orig).e + 0xc) = uVar5;
  (scattered->dir).e[0] = dVar10 * (double)CONCAT44(uVar7,uVar6);
  (scattered->dir).e[1] = dVar10 * (double)CONCAT44(uVar9,uVar8);
  (scattered->dir).e[2] = local_38 * dVar10;
  scattered->tm = dVar11;
  peVar1 = (this->tex).super___shared_ptr<texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_texture[2])(SUB84(rec->u,0),rec->v,&local_48,peVar1,rec);
  attenuation->e[2] = local_38;
  attenuation->e[0] = local_48;
  attenuation->e[1] = dStack_40;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, color& attenuation, ray& scattered)
    const override {
        scattered = ray(rec.p, random_unit_vector(), r_in.time());
        attenuation = tex->value(rec.u, rec.v, rec.p);
        return true;
    }